

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O2

long __thiscall
AmsConnection::DeleteNotification
          (AmsConnection *this,AmsAddr *amsAddr,uint32_t hNotify,uint32_t tmms,uint16_t port)

{
  long lVar1;
  uint32_t local_6c;
  AmsRequest request;
  
  AmsRequest::AmsRequest(&request,amsAddr,port,7,0,(void *)0x0,(uint32_t *)0x0,4);
  local_6c = hNotify;
  Frame::prepend<unsigned_int>(&request.frame,&local_6c);
  lVar1 = AdsRequest(this,&request,tmms);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&request);
  return lVar1;
}

Assistant:

long AmsConnection::DeleteNotification(const AmsAddr& amsAddr, uint32_t hNotify, uint32_t tmms, uint16_t port)
{
    AmsRequest request {
        amsAddr,
        port, AoEHeader::DEL_DEVICE_NOTIFICATION,
        0, nullptr, nullptr,
        sizeof(hNotify)
    };
    request.frame.prepend(bhf::ads::htole(hNotify));
    return AdsRequest(request, tmms);
}